

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
Variable_hasEquivalentVariableWithNullptr_Test::Variable_hasEquivalentVariableWithNullptr_Test
          (Variable_hasEquivalentVariableWithNullptr_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00139740;
  return;
}

Assistant:

TEST(Variable, hasEquivalentVariableWithNullptr)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    c1->setName("component1");
    v1->setName("variable1");
    v1->setUnits("dimensionless");

    c1->addVariable(v1);
    m->addComponent(c1);

    EXPECT_FALSE(v1->hasEquivalentVariable(nullptr));
}